

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  UnitTest *this;
  int local_14;
  
  testing::FLAGS_gtest_catch_exceptions = 0;
  std::__cxx11::string::_M_replace
            (0x1458a8,0,(char *)testing::FLAGS_gtest_death_test_style_abi_cxx11_._8_8_,0x130004);
  testing::InitGoogleTest(&local_14,argv);
  this = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(this);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    ::testing::GTEST_FLAG(catch_exceptions) = false;
    ::testing::GTEST_FLAG(death_test_style) = "threadsafe";
    //::testing::GTEST_FLAG(filter) = "RecoveryTest.AccessViolationTest";

    ::testing::InitGoogleTest(&argc, argv);
    return RUN_ALL_TESTS();
}